

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int get_req_headers(mg_request_info *ri,char *name,char **output,int output_max_size)

{
  int iVar1;
  int local_2c;
  int local_28;
  int cnt;
  int i;
  int output_max_size_local;
  char **output_local;
  char *name_local;
  mg_request_info *ri_local;
  
  local_2c = 0;
  if (ri != (mg_request_info *)0x0) {
    for (local_28 = 0; local_28 < ri->num_headers && local_2c < output_max_size;
        local_28 = local_28 + 1) {
      iVar1 = mg_strcasecmp(name,ri->http_headers[local_28].name);
      if (iVar1 == 0) {
        output[local_2c] = ri->http_headers[local_28].value;
        local_2c = local_2c + 1;
      }
    }
  }
  return local_2c;
}

Assistant:

static int
get_req_headers(const struct mg_request_info *ri,
                const char *name,
                const char **output,
                int output_max_size)
{
	int i;
	int cnt = 0;
	if (ri) {
		for (i = 0; i < ri->num_headers && cnt < output_max_size; i++) {
			if (!mg_strcasecmp(name, ri->http_headers[i].name)) {
				output[cnt++] = ri->http_headers[i].value;
			}
		}
	}
	return cnt;
}